

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTableCopyExpr
          (BinaryReaderIR *this,Index dst_index,Index src_index)

{
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  Result RVar3;
  Expr *pEVar4;
  Location loc_1;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_108;
  Location local_100;
  Location local_e0;
  Var local_c0;
  Var local_78;
  
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e0.field_1.field_0.last_column = 0;
  local_e0.filename._M_len = strlen(pcVar1);
  local_e0.filename._M_str = pcVar1;
  local_e0.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_78,dst_index,&local_e0);
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_100.field_1.field_0.last_column = 0;
  local_100.filename._M_len = strlen(pcVar1);
  local_100.filename._M_str = pcVar1;
  local_100.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_c0,src_index,&local_100);
  pEVar4 = (Expr *)operator_new(0xd0);
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar4->loc).filename._M_len = 0;
  (pEVar4->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(pEVar4->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar4->loc).field_1.field_1.offset + 4) = 0;
  pEVar4->type_ = TableCopy;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__TableCopyExpr_0023ed88;
  Var::Var((Var *)(pEVar4 + 1),&local_78);
  Var::Var((Var *)&pEVar4[2].super_intrusive_list_base<wabt::Expr>,&local_c0);
  local_108._M_head_impl = pEVar4;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_108);
  if (local_108._M_head_impl != (Expr *)0x0) {
    (*(local_108._M_head_impl)->_vptr_Expr[1])();
  }
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableCopyExpr(Index dst_index, Index src_index) {
  return AppendExpr(std::make_unique<TableCopyExpr>(
      Var(dst_index, GetLocation()), Var(src_index, GetLocation())));
}